

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Stress::(anonymous_namespace)::BlendingCase::genVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_19;
  void *local_18;
  BlendingCase *this_local;
  
  local_18 = this;
  this_local = (BlendingCase *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 300 es\nin highp vec4 a_pos;\nvoid main ()\n{\n\tgl_Position = a_pos;\n}\n",
             &local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string BlendingCase::genVertexSource (void) const
{
	return
		"#version 300 es\n"
		"in highp vec4 a_pos;\n"
		"void main ()\n"
		"{\n"
		"	gl_Position = a_pos;\n"
		"}\n";
}